

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int recomputeColumnsUsedExpr(Walker *pWalker,Expr *pExpr)

{
  Bitmask *pBVar1;
  SrcItem *pSVar2;
  Bitmask BVar3;
  
  if (((pExpr->op == 0xa7) && (pSVar2 = (pWalker->u).pSrcItem, pSVar2->iCursor == pExpr->iTable)) &&
     (-1 < pExpr->iColumn)) {
    BVar3 = sqlite3ExprColUsed((Expr *)(ulong)(ushort)pExpr->iColumn);
    pBVar1 = &pSVar2->colUsed;
    *pBVar1 = *pBVar1 | BVar3;
  }
  return 0;
}

Assistant:

static int recomputeColumnsUsedExpr(Walker *pWalker, Expr *pExpr){
  SrcItem *pItem;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  pItem = pWalker->u.pSrcItem;
  if( pItem->iCursor!=pExpr->iTable ) return WRC_Continue;
  if( pExpr->iColumn<0 ) return WRC_Continue;
  pItem->colUsed |= sqlite3ExprColUsed(pExpr);
  return WRC_Continue;
}